

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

bool AM_isTriggerSpecial(int special,int *param_2)

{
  FLineSpecial *pFVar1;
  bool local_21;
  FLineSpecial *spec;
  int *param_1_local;
  int special_local;
  
  pFVar1 = P_GetLineSpecialInfo(special);
  local_21 = false;
  if ((((pFVar1 != (FLineSpecial *)0x0) && (local_21 = false, -1 < pFVar1->max_args)) &&
      (local_21 = false, special != 0xb)) &&
     (((local_21 = false, special != 10 && (local_21 = false, special != 0xf9)) &&
      ((local_21 = false, special != 0xc && (local_21 = false, special != 0xe)))))) {
    local_21 = special != 0xca;
  }
  return local_21;
}

Assistant:

bool AM_isTriggerSpecial (int special, int *)
{
	FLineSpecial *spec = P_GetLineSpecialInfo(special);
	return spec != NULL
		&& spec->max_args >= 0
		&& special != Door_Open
		&& special != Door_Close
		&& special != Door_CloseWaitOpen
		&& special != Door_Raise
		&& special != Door_Animated
		&& special != Generic_Door;
}